

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O2

RoundData *
rest_rpc::MD5::MD5CE::GetRoundData
          (RoundData *__return_storage_ptr__,char *data,uint32_t n,uint32_t m,uint32_t i)

{
  uint32_t uVar1;
  
  uVar1 = GetPaddedMessageWord(data,n,m,i);
  __return_storage_ptr__->_M_elems[0] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 4);
  __return_storage_ptr__->_M_elems[1] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 8);
  __return_storage_ptr__->_M_elems[2] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0xc);
  __return_storage_ptr__->_M_elems[3] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x10);
  __return_storage_ptr__->_M_elems[4] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x14);
  __return_storage_ptr__->_M_elems[5] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x18);
  __return_storage_ptr__->_M_elems[6] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x1c);
  __return_storage_ptr__->_M_elems[7] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x20);
  __return_storage_ptr__->_M_elems[8] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x24);
  __return_storage_ptr__->_M_elems[9] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x28);
  __return_storage_ptr__->_M_elems[10] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x2c);
  __return_storage_ptr__->_M_elems[0xb] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x30);
  __return_storage_ptr__->_M_elems[0xc] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x34);
  __return_storage_ptr__->_M_elems[0xd] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x38);
  __return_storage_ptr__->_M_elems[0xe] = uVar1;
  uVar1 = GetPaddedMessageWord(data,n,m,i + 0x3c);
  __return_storage_ptr__->_M_elems[0xf] = uVar1;
  return __return_storage_ptr__;
}

Assistant:

static RoundData GetRoundData(const char *data, const uint32_t n,
                                const uint32_t m, const uint32_t i) {
    //    DCHECK_EQ(i % 64, 0u);
    //    DCHECK_LT(i, m);
    //    DCHECK_LT(n, m);
    //    DCHECK_EQ(m % 64, 0u);
    return RoundData{{GetPaddedMessageWord(data, n, m, i),
                      GetPaddedMessageWord(data, n, m, i + 4),
                      GetPaddedMessageWord(data, n, m, i + 8),
                      GetPaddedMessageWord(data, n, m, i + 12),
                      GetPaddedMessageWord(data, n, m, i + 16),
                      GetPaddedMessageWord(data, n, m, i + 20),
                      GetPaddedMessageWord(data, n, m, i + 24),
                      GetPaddedMessageWord(data, n, m, i + 28),
                      GetPaddedMessageWord(data, n, m, i + 32),
                      GetPaddedMessageWord(data, n, m, i + 36),
                      GetPaddedMessageWord(data, n, m, i + 40),
                      GetPaddedMessageWord(data, n, m, i + 44),
                      GetPaddedMessageWord(data, n, m, i + 48),
                      GetPaddedMessageWord(data, n, m, i + 52),
                      GetPaddedMessageWord(data, n, m, i + 56),
                      GetPaddedMessageWord(data, n, m, i + 60)}};
  }